

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void __thiscall
soul::ResolutionPass::rebuildVariableUseCounts::UseCounter::~UseCounter(UseCounter *this)

{
  UseCounter *this_local;
  
  ~UseCounter(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

void visit (AST::Assignment& a) override
            {
                auto oldWriting = isWriting;
                auto oldReading = isReading;
                isReading = false;
                isWriting = true;
                visitObject (a.target);
                isWriting = oldWriting;
                isReading = oldReading;
                visitObject (a.newValue);
            }